

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O1

void FAudio_OPERATIONSET_Execute(FAudio *audio)

{
  FAudio_OPERATIONSET_Type FVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudioFreeFunc p_Var3;
  FAudio_OPERATIONSET_Operation *pFVar4;
  long lVar5;
  
  FAudio_PlatformLockMutex(audio->operationLock);
  pFVar4 = audio->committedOperations;
  do {
    if (pFVar4 == (FAudio_OPERATIONSET_Operation *)0x0) {
      audio->committedOperations = (FAudio_OPERATIONSET_Operation *)0x0;
      FAudio_PlatformUnlockMutex(audio->operationLock);
      return;
    }
    pFVar2 = pFVar4->next;
    switch(pFVar4->Type) {
    case FAUDIOOP_ENABLEEFFECT:
      FAudioVoice_EnableEffect(pFVar4->Voice,(pFVar4->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_DISABLEEFFECT:
      FAudioVoice_DisableEffect(pFVar4->Voice,(pFVar4->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_SETEFFECTPARAMETERS:
      FAudioVoice_SetEffectParameters
                (pFVar4->Voice,(pFVar4->Data).SetEffectParameters.EffectIndex,
                 (pFVar4->Data).SetEffectParameters.pParameters,
                 (pFVar4->Data).SetEffectParameters.ParametersByteSize,0);
      break;
    case FAUDIOOP_SETFILTERPARAMETERS:
      FAudioVoice_SetFilterParameters
                (pFVar4->Voice,(FAudioFilterParameters *)&(pFVar4->Data).EnableEffect,0);
      break;
    case FAUDIOOP_SETOUTPUTFILTERPARAMETERS:
      FAudioVoice_SetOutputFilterParameters
                (pFVar4->Voice,(pFVar4->Data).SetOutputFilterParameters.pDestinationVoice,
                 (FAudioFilterParameters *)&(pFVar4->Data).SetFilterParameters.Parameters.OneOverQ,0
                );
      break;
    case FAUDIOOP_SETVOLUME:
      FAudioVoice_SetVolume(pFVar4->Voice,(float)(pFVar4->Data).EnableEffect.EffectIndex,0);
      break;
    case FAUDIOOP_SETCHANNELVOLUMES:
      FAudioVoice_SetChannelVolumes
                (pFVar4->Voice,(pFVar4->Data).SetEffectParameters.EffectIndex,
                 (pFVar4->Data).SetChannelVolumes.pVolumes,0);
      break;
    case FAUDIOOP_SETOUTPUTMATRIX:
      FAudioVoice_SetOutputMatrix
                (pFVar4->Voice,(pFVar4->Data).SetOutputFilterParameters.pDestinationVoice,
                 (pFVar4->Data).SetOutputMatrix.SourceChannels,
                 (pFVar4->Data).SetOutputMatrix.DestinationChannels,
                 (pFVar4->Data).SetOutputMatrix.pLevelMatrix,0);
      break;
    case FAUDIOOP_START:
      FAudioSourceVoice_Start(pFVar4->Voice,(pFVar4->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_STOP:
      FAudioSourceVoice_Stop(pFVar4->Voice,(pFVar4->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_EXITLOOP:
      FAudioSourceVoice_ExitLoop(pFVar4->Voice,0);
      break;
    case FAUDIOOP_SETFREQUENCYRATIO:
      FAudioSourceVoice_SetFrequencyRatio
                (pFVar4->Voice,(float)(pFVar4->Data).EnableEffect.EffectIndex,0);
    }
    p_Var3 = audio->pFree;
    FVar1 = pFVar4->Type;
    lVar5 = 0x18;
    if ((FVar1 == FAUDIOOP_SETEFFECTPARAMETERS) || (FVar1 == FAUDIOOP_SETCHANNELVOLUMES)) {
LAB_0011c28d:
      (*p_Var3)(*(void **)((long)&pFVar4->Type + lVar5));
    }
    else if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
      lVar5 = 0x20;
      goto LAB_0011c28d;
    }
    (*p_Var3)(pFVar4);
    pFVar4 = pFVar2;
  } while( true );
}

Assistant:

void FAudio_OPERATIONSET_Execute(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *op, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	op = audio->committedOperations;
	while (op != NULL)
	{
		next = op->next;
		ExecuteOperation(op);
		DeleteOperation(op, audio->pFree);
		op = next;
	}
	audio->committedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}